

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall JetHead::list<FooListener_*>::list(list<FooListener_*> *this)

{
  Node *pNVar1;
  list<FooListener_*> *this_local;
  
  pNVar1 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0x37);
  this->mHead = pNVar1;
  pNVar1 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0x38);
  this->mTail = pNVar1;
  this->mHead->next = this->mTail;
  this->mHead->prev = (Node *)0x0;
  this->mTail->prev = this->mHead;
  this->mTail->next = (Node *)0x0;
  return;
}

Assistant:

list()
			: mHead(jh_new Node),
			  mTail(jh_new Node)
		{ 
			mHead->next = mTail;
			mHead->prev = NULL;
			mTail->prev = mHead;
			mTail->next = NULL;
		}